

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpnam.c
# Opt level: O2

char * tmpnam(char *__s)

{
  FILE *__stream;
  char *__dest;
  
  __stream = tmpfile();
  __dest = tmpnam::filename;
  if (__s != (char *)0x0) {
    __dest = __s;
  }
  strcpy(__dest,*(char **)&__stream->_fileno);
  fclose(__stream);
  return __dest;
}

Assistant:

char * tmpnam( char * s )
{
    static char filename[ L_tmpnam ];
    FILE * file = tmpfile();

    if ( s == NULL )
    {
        s = filename;
    }

    strcpy( s, file->filename );
    fclose( file );
    return s;
}